

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

int Gia_ManAppendCi(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  uint *puVar8;
  long lVar9;
  
  uVar1 = p->nObjs;
  uVar2 = p->nObjsAlloc;
  if (uVar1 == uVar2) {
    uVar6 = uVar2 * 2;
    if (0x1fffffff < (int)(uVar2 * 2)) {
      uVar6 = 0x20000000;
    }
    if (uVar1 == 0x20000000) {
      puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
      exit(1);
    }
    if ((int)uVar6 <= (int)uVar1) {
      __assert_fail("p->nObjs < nObjNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x24c,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    if (p->fVerbose != 0) {
      printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar2,(ulong)uVar6);
    }
    if (p->nObjsAlloc < 1) {
      __assert_fail("p->nObjsAlloc > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x24f,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    lVar9 = (long)(int)uVar6;
    if (p->pObjs == (Gia_Obj_t *)0x0) {
      pGVar7 = (Gia_Obj_t *)malloc(lVar9 * 0xc);
    }
    else {
      pGVar7 = (Gia_Obj_t *)realloc(p->pObjs,lVar9 * 0xc);
    }
    p->pObjs = pGVar7;
    memset(pGVar7 + p->nObjsAlloc,0,(lVar9 - p->nObjsAlloc) * 0xc);
    if (p->pMuxes != (uint *)0x0) {
      puVar8 = (uint *)realloc(p->pMuxes,lVar9 * 4);
      p->pMuxes = puVar8;
      memset(puVar8 + p->nObjsAlloc,0,(lVar9 - p->nObjsAlloc) * 4);
    }
    p->nObjsAlloc = uVar6;
  }
  iVar3 = p->nObjs;
  p->nObjs = iVar3 + 1;
  if ((long)iVar3 < 0) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar7 = p->pObjs + iVar3;
  uVar4 = *(ulong *)pGVar7;
  *(ulong *)pGVar7 = uVar4 | 0x9fffffff;
  *(ulong *)pGVar7 =
       uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
  pGVar5 = p->pObjs;
  if ((pGVar5 <= pGVar7) && (pGVar7 < pGVar5 + p->nObjs)) {
    Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar5) >> 2) * -0x55555555);
    pGVar5 = p->pObjs;
    if ((pGVar5 <= pGVar7) && (pGVar7 < pGVar5 + p->nObjs)) {
      return (int)((ulong)((long)pGVar7 - (long)pGVar5) >> 2) * 0x55555556;
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Gia_ManAppendCi( Gia_Man_t * p )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    pObj->fTerm = 1;
    pObj->iDiff0 = GIA_NONE;
    pObj->iDiff1 = Vec_IntSize( p->vCis );
    Vec_IntPush( p->vCis, Gia_ObjId(p, pObj) );
    return Gia_ObjId( p, pObj ) << 1;
}